

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cc
# Opt level: O2

int Publisher::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  string *psVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  runtime_error *prVar6;
  string *psVar7;
  undefined4 in_register_0000003c;
  string asStack_1c8 [32];
  stringstream ss;
  ostream local_198 [376];
  
  iVar2 = nn_socket(1,0x20);
  if (iVar2 < 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar4 = std::operator<<(local_198,"nn_socket: ");
    iVar2 = nn_errno();
    pcVar5 = nn_strerror(iVar2);
    std::operator<<(poVar4,pcVar5);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar7 = *(string **)CONCAT44(in_register_0000003c,__fd);
  psVar1 = (string *)((undefined8 *)CONCAT44(in_register_0000003c,__fd))[1];
  while( true ) {
    if (psVar7 == psVar1) {
      return iVar2;
    }
    iVar3 = nn_bind(iVar2,*(char **)psVar7);
    if (iVar3 < 0) break;
    psVar7 = psVar7 + 0x20;
  }
  nn_close(iVar2);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar4 = std::operator<<(local_198,"nn_bind: ");
  iVar2 = nn_errno();
  pcVar5 = nn_strerror(iVar2);
  std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(local_198," (");
  poVar4 = std::operator<<(poVar4,psVar7);
  std::operator<<(poVar4,")");
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,asStack_1c8);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int Publisher::bind(const std::vector<std::string>& endpoints) {
  auto fd = nn_socket(AF_SP, NN_PUB);
  if (fd < 0) {
    std::stringstream ss;
    ss << "nn_socket: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  for (const auto& endpoint : endpoints) {
    auto rv = nn_bind(fd, endpoint.c_str());
    if (rv < 0) {
      nn_close(fd);
      std::stringstream ss;
      ss << "nn_bind: " << nn_strerror(nn_errno());
      ss << " (" << endpoint << ")";
      throw std::runtime_error(ss.str());
    }
  }

  return fd;
}